

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_ego_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  errr eVar3;
  void *pvVar4;
  char *pcVar5;
  char *flag_name;
  parser_error pVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar6 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar5 = parser_getstr(p,"flags");
      pcVar5 = string_make(pcVar5);
      flag_name = strtok(pcVar5," |");
      if (flag_name == (char *)0x0) {
        pVar6 = PARSE_ERROR_NONE;
      }
      else {
        do {
          eVar2 = grab_flag((bitflag *)((long)pvVar4 + 0x20),5,obj_flags,flag_name);
          eVar3 = grab_flag((bitflag *)((long)pvVar4 + 0x2a),2,kind_flags,flag_name);
          _Var1 = grab_element_flag((element_info *)((long)pvVar4 + 0x16c),flag_name);
          if (((!_Var1) && (eVar3 != 0)) && (eVar2 != 0)) {
            pVar6 = PARSE_ERROR_INVALID_FLAG;
            break;
          }
          pVar6 = PARSE_ERROR_NONE;
          flag_name = strtok((char *)0x0," |");
        } while (flag_name != (char *)0x0);
      }
      string_free(pcVar5);
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_ego_flags(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	char *flags;
	char *t;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	flags = string_make(parser_getstr(p, "flags"));
	t = strtok(flags, " |");
	while (t) {
		bool found = false;
		if (!grab_flag(e->flags, OF_SIZE, obj_flags, t)) {
			found = true;
		}
		if (!grab_flag(e->kind_flags, KF_SIZE, kind_flags, t)) {
			found = true;
		}
		if (grab_element_flag(e->el_info, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}
	string_free(flags);
	return t ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}